

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

char * duckdb::StringUtil::EnumToString
                 (EnumStringLiteral *enum_list,idx_t enum_count,char *enum_name,uint32_t enum_value)

{
  NotImplementedException *this;
  long lVar1;
  EnumStringLiteral *pEVar2;
  allocator local_41;
  string local_40;
  
  lVar1 = enum_count + 1;
  do {
    pEVar2 = enum_list;
    lVar1 = lVar1 + -1;
    if (lVar1 == 0) {
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"Enum value: unrecognized enum value \"%d\" for enum \"%s\"",
                 &local_41);
      NotImplementedException::NotImplementedException<unsigned_int,char_const*>
                (this,&local_40,enum_value,enum_name);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    enum_list = pEVar2 + 1;
  } while (pEVar2->number != enum_value);
  return pEVar2->string;
}

Assistant:

const char *StringUtil::EnumToString(const EnumStringLiteral enum_list[], idx_t enum_count, const char *enum_name,
                                     uint32_t enum_value) {
	for (idx_t i = 0; i < enum_count; i++) {
		if (enum_list[i].number == enum_value) {
			return enum_list[i].string;
		}
	}
	throw NotImplementedException("Enum value: unrecognized enum value \"%d\" for enum \"%s\"", enum_value, enum_name);
}